

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

string * __thiscall cmake::ReportCapabilities_abi_cxx11_(string *__return_storage_ptr__,cmake *this)

{
  size_t in_RCX;
  FastWriter writer;
  Value VStack_88;
  FastWriter local_60;
  string local_30 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Json::FastWriter::FastWriter(&local_60);
  ReportCapabilitiesJson(&VStack_88,this);
  Json::FastWriter::write_abi_cxx11_((FastWriter *)local_30,(int)&local_60,&VStack_88,in_RCX);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_30);
  std::__cxx11::string::~string(local_30);
  Json::Value::~Value(&VStack_88);
  Json::FastWriter::~FastWriter(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::ReportCapabilities() const
{
  std::string result;
#if defined(CMAKE_BUILD_WITH_CMAKE)
  Json::FastWriter writer;
  result = writer.write(this->ReportCapabilitiesJson());
#else
  result = "Not supported";
#endif
  return result;
}